

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

int Am_Set_Old_Owner_To_Me_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Wrapper *value_00;
  Am_Object local_40;
  Am_Object cmd;
  undefined1 local_28 [8];
  Am_Value value;
  Am_Object *self_local;
  
  value.value = (anon_union_8_8_ea4c8939_for_value)self;
  Am_Value::Am_Value((Am_Value *)local_28);
  in_value = Am_Object::Peek((Am_Object *)value.value.wrapper_value,0xc5,0);
  Am_Value::operator=((Am_Value *)local_28,in_value);
  bVar1 = Am_Value::Valid((Am_Value *)local_28);
  if ((bVar1) && (local_28._0_2_ == 0xa001)) {
    Am_Object::Am_Object(&local_40);
    Am_Object::operator=(&local_40,(Am_Value *)local_28);
    value_00 = Am_Object::operator_cast_to_Am_Wrapper_(value.value.wrapper_value);
    Am_Object::Set(&local_40,0x170,value_00,1);
    self_local._4_4_ = 1;
    Am_Object::~Am_Object(&local_40);
  }
  else {
    self_local._4_4_ = 0;
  }
  Am_Value::~Am_Value((Am_Value *)local_28);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, Am_Set_Old_Owner_To_Me)
{
  Am_Value value;
  value = self.Peek(Am_COMMAND);
  if (value.Valid() && value.type == Am_OBJECT) {
    Am_Object cmd;
    cmd = value;
    cmd.Set(Am_SAVED_OLD_OWNER, self, Am_OK_IF_NOT_THERE);
    return 1;
  }
  return 0;
}